

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O0

char * crnlib::crn_strdup(char *pStr)

{
  size_t sVar1;
  char *__dest;
  char *p;
  size_t l;
  char *pStr_local;
  
  l = (size_t)pStr;
  if (pStr == (char *)0x0) {
    l = (long)"\x05\x05\x04" + 3;
  }
  sVar1 = strlen((char *)l);
  __dest = (char *)crnlib_malloc(sVar1 + 1);
  if (__dest != (char *)0x0) {
    memcpy(__dest,(void *)l,sVar1 + 1);
  }
  return __dest;
}

Assistant:

char* crn_strdup(const char* pStr)
    {
        if (!pStr)
        {
            pStr = "";
        }

        size_t l = strlen(pStr) + 1;
        char* p = (char*)crnlib_malloc(l);
        if (p)
        {
            memcpy(p, pStr, l);
        }

        return p;
    }